

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkPotentiallyNullableOperands(CheckerVisitor *this,BinExpr *bin)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  TreeOp TVar6;
  Node *pNVar7;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  CheckerVisitor *unaff_retaddr;
  bool rhsNullable;
  bool lhsNullable;
  char *opType;
  Expr *rhs;
  Expr *lhs;
  bool isAssign;
  bool isArithOp;
  bool isRelOp;
  TreeOp op;
  char *local_50;
  bool local_41;
  undefined1 in_stack_ffffffffffffffe8;
  CheckerVisitor *e;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    e = in_RDI;
    TVar6 = Node::op((Node *)in_RSI);
    bVar1 = isBoolRelationOperator(TVar6);
    uVar2 = isPureArithOperator(TVar6);
    local_41 = TVar6 == TO_ASSIGN || TVar6 == TO_NEWSLOT;
    if ((((bVar1 & 1) != 0) || ((bool)uVar2)) || (local_41)) {
      pNVar7 = &BinExpr::lhs(in_RSI)->super_Node;
      BinExpr::rhs(in_RSI);
      if ((bVar1 & 1) == 0) {
        local_50 = "Arithmetic operation";
      }
      else {
        local_50 = "Comparison operation";
      }
      bVar3 = isPotentiallyNullable(unaff_retaddr,(Expr *)e);
      bVar4 = isPotentiallyNullable(unaff_retaddr,(Expr *)e);
      if (((bVar3) || (bVar4)) &&
         ((bVar5 = couldBeString((CheckerVisitor *)
                                 CONCAT44(TVar6,CONCAT13(bVar1,CONCAT12(uVar2,CONCAT11(local_41,
                                                  in_stack_ffffffffffffffe8)))),(Expr *)pNVar7),
          !bVar5 && (bVar5 = couldBeString((CheckerVisitor *)
                                           CONCAT44(TVar6,CONCAT13(bVar1,CONCAT12(uVar2,CONCAT11(
                                                  local_41,in_stack_ffffffffffffffe8)))),
                                           (Expr *)pNVar7), !bVar5)))) {
        if (bVar3) {
          if ((local_41 & 1U) == 0) {
            pNVar7 = &BinExpr::lhs(in_RSI)->super_Node;
            report(in_RDI,pNVar7,0x39,local_50);
          }
          else {
            TVar6 = Node::op(pNVar7);
            if (TVar6 != TO_ID) {
              pNVar7 = &BinExpr::lhs(in_RSI)->super_Node;
              report(in_RDI,pNVar7,0x3f);
            }
          }
        }
        if ((bVar4) && ((local_41 & 1U) == 0)) {
          pNVar7 = &BinExpr::rhs(in_RSI)->super_Node;
          report(in_RDI,pNVar7,0x39,local_50);
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkPotentiallyNullableOperands(const BinExpr *bin) {

  if (effectsOnly)
    return;

  enum TreeOp op = bin->op();

  bool isRelOp = isBoolRelationOperator(op);
  bool isArithOp = isPureArithOperator(op);
  bool isAssign = op == TO_ASSIGN || op == TO_NEWSLOT;

  if (!isRelOp && !isArithOp && !isAssign)
    return;

  const Expr *lhs = bin->lhs();
  const Expr *rhs = bin->rhs();

  const char *opType = isRelOp ? "Comparison operation" : "Arithmetic operation";


  bool lhsNullable = isPotentiallyNullable(lhs);
  bool rhsNullable = isPotentiallyNullable(rhs);

  if (!lhsNullable && !rhsNullable)
    return;

  // string concat with nullable is OK
  if (couldBeString(lhs) || couldBeString(rhs))
    return;

  if (lhsNullable) {
    if (isAssign) {
      if (lhs->op() != TO_ID) { // -V522
        report(bin->lhs(), DiagnosticsId::DI_NULLABLE_ASSIGNMENT);
      }
    }
    else {
      report(bin->lhs(), DiagnosticsId::DI_NULLABLE_OPERANDS, opType);
    }
  }

  if (rhsNullable && !isAssign) {
    report(bin->rhs(), DiagnosticsId::DI_NULLABLE_OPERANDS, opType);
  }
}